

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzlib.c
# Opt level: O2

void gz_reset(gz_statep state)

{
  (state->x).have = 0;
  if (state->mode == 0x1c4f) {
    state->eof = 0;
    state->past = 0;
    state->how = 0;
  }
  else {
    state->reset = 0;
  }
  state->seek = 0;
  cm_zlib_gz_error(state,0,(char *)0x0);
  (state->x).pos = 0;
  (state->strm).avail_in = 0;
  return;
}

Assistant:

local void gz_reset(gz_statep state) {
    state->x.have = 0;              /* no output data available */
    if (state->mode == GZ_READ) {   /* for reading ... */
        state->eof = 0;             /* not at end of file */
        state->past = 0;            /* have not read past end yet */
        state->how = LOOK;          /* look for gzip header */
    }
    else                            /* for writing ... */
        state->reset = 0;           /* no deflateReset pending */
    state->seek = 0;                /* no seek request pending */
    gz_error(state, Z_OK, NULL);    /* clear error */
    state->x.pos = 0;               /* no uncompressed data yet */
    state->strm.avail_in = 0;       /* no input data yet */
}